

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall
google::protobuf::EnumDescriptorProto::Swap(EnumDescriptorProto *this,EnumDescriptorProto *other)

{
  EnumDescriptorProto *other_local;
  EnumDescriptorProto *this_local;
  
  if (other != this) {
    std::swap<std::__cxx11::string*>(&this->name_,&other->name_);
    RepeatedPtrField<google::protobuf::EnumValueDescriptorProto>::Swap(&this->value_,&other->value_)
    ;
    std::swap<google::protobuf::EnumOptions*>(&this->options_,&other->options_);
    std::swap<unsigned_int>(this->_has_bits_,other->_has_bits_);
    UnknownFieldSet::Swap(&this->_unknown_fields_,&other->_unknown_fields_);
    std::swap<int>(&this->_cached_size_,&other->_cached_size_);
  }
  return;
}

Assistant:

void EnumDescriptorProto::Swap(EnumDescriptorProto* other) {
  if (other != this) {
    std::swap(name_, other->name_);
    value_.Swap(&other->value_);
    std::swap(options_, other->options_);
    std::swap(_has_bits_[0], other->_has_bits_[0]);
    _unknown_fields_.Swap(&other->_unknown_fields_);
    std::swap(_cached_size_, other->_cached_size_);
  }
}